

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGStreamPostalService.h
# Opt level: O0

bool __thiscall VCGStreamPostalService::StartService(VCGStreamPostalService *this)

{
  bool bVar1;
  VCGStreamPostalService *local_90;
  code *local_88;
  undefined8 local_80;
  type local_78;
  thread local_60;
  io_context local_50 [2];
  shared_ptr<boost::asio::io_context> local_30;
  undefined1 local_20 [8];
  scoped_lock Lock;
  VCGStreamPostalService *this_local;
  
  Lock._8_8_ = this;
  boost::unique_lock<boost::mutex>::unique_lock
            ((unique_lock<boost::mutex> *)local_20,&this->m_Mutex);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pService);
  if (!bVar1) {
    std::make_shared<boost::asio::io_context>();
    std::shared_ptr<boost::asio::io_context>::operator=(&this->m_pService,&local_30);
    std::shared_ptr<boost::asio::io_context>::~shared_ptr(&local_30);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pWork);
  if (!bVar1) {
    std::__shared_ptr_access<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&this->m_pService);
    std::make_shared<boost::asio::io_context::work,boost::asio::io_context&>(local_50);
    std::shared_ptr<boost::asio::io_context::work>::operator=
              (&this->m_pWork,(shared_ptr<boost::asio::io_context::work> *)local_50);
    std::shared_ptr<boost::asio::io_context::work>::~shared_ptr
              ((shared_ptr<boost::asio::io_context::work> *)local_50);
    local_88 = ThreadFunction;
    local_80 = 0;
    local_90 = this;
    std::bind<void(VCGStreamPostalService::*)(),VCGStreamPostalService*>
              (&local_78,(offset_in_VCGStreamPostalService_to_subr *)&local_88,&local_90);
    boost::thread::thread<std::_Bind<void(VCGStreamPostalService::*(VCGStreamPostalService*))()>>
              (&local_60,&local_78);
    boost::thread::operator=(&this->m_Thread,&local_60);
    boost::thread::~thread(&local_60);
  }
  boost::unique_lock<boost::mutex>::~unique_lock((unique_lock<boost::mutex> *)local_20);
  return true;
}

Assistant:

bool StartService()
  {
    boost::mutex::scoped_lock Lock( m_Mutex );
    if( !m_pService )
    {
      m_pService = std::make_shared< boost::asio::io_service >();
    }

    if( !m_pWork )
    {
      m_pWork = std::make_shared< boost::asio::io_service::work >( *m_pService );
      m_Thread = boost::thread( std::bind( &VCGStreamPostalService::ThreadFunction, this ) );
    }

    return true;
  }